

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.cpp
# Opt level: O3

bool __thiscall spvtools::opt::VectorDCE::HasVectorResult(VectorDCE *this,Instruction *inst)

{
  IRContext *this_00;
  TypeManager *this_01;
  uint32_t uVar1;
  uint32_t id;
  Type *pTVar2;
  bool bVar3;
  
  this_00 = (this->super_MemPass).super_Pass.context_;
  if ((this_00->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(this_00);
  }
  if (inst->has_type_id_ == true) {
    this_01 = (this_00->type_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
    bVar3 = false;
    id = 0;
    uVar1 = Instruction::GetSingleWordOperand(inst,0);
    if (uVar1 != 0) {
      if (inst->has_type_id_ == true) {
        id = Instruction::GetSingleWordOperand(inst,0);
      }
      pTVar2 = analysis::TypeManager::GetType(this_01,id);
      bVar3 = pTVar2->kind_ == kVector;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool VectorDCE::HasVectorResult(const Instruction* inst) const {
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  if (inst->type_id() == 0) {
    return false;
  }

  const analysis::Type* current_type = type_mgr->GetType(inst->type_id());
  switch (current_type->kind()) {
    case analysis::Type::kVector:
      return true;
    default:
      return false;
  }
}